

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O3

Type * __thiscall
slang::ast::EnumType::fromSyntax
          (EnumType *this,Compilation *comp,EnumTypeSyntax *syntax,ASTContext *context,
          function_ref<void_(const_slang::ast::Symbol_&)> insertCB)

{
  DataTypeSyntax *node;
  Compilation *compilation;
  size_t sVar1;
  EqualsValueClauseSyntax *pEVar2;
  int *piVar3;
  bool bVar4;
  bitwidth_t bVar5;
  EnumType *pEVar6;
  SourceLocation SVar7;
  Diagnostic *diag;
  Type *pTVar8;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar9;
  EnumValueSymbol *pEVar10;
  EnumType *pEVar11;
  SyntaxNode *pSVar12;
  _Optional_payload_base<int> index;
  undefined1 *puVar13;
  RangeSelectSyntax *range;
  ulong uVar14;
  string_view sVar15;
  SourceRange SVar16;
  bool first;
  bitwidth_t bitWidth;
  Type *cb;
  Type *base;
  SVInt one;
  SVInt allOnes;
  EvaluatedDimension dim;
  anon_class_80_10_279d319d inferValue;
  anon_class_56_7_20ba5b4c setInitializer;
  SourceRange previousRange;
  ConstantValue previous;
  anon_class_16_2_bd45431b checkValue;
  SmallMap<slang::SVInt,_slang::SourceLocation,_8UL,_std::pair<const_slang::SVInt,_slang::SourceLocation>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::SVInt,_slang::SourceLocation>,_192UL,_16UL>_>
  usedValues;
  bool local_2a5;
  bitwidth_t local_2a4;
  EnumType *local_2a0;
  Compilation *local_298;
  EnumType *local_290;
  EnumType *local_288;
  Scope *local_280;
  ASTContext *local_278;
  _func_void_intptr_t_Symbol_ptr *local_270;
  EnumValueSymbol *local_268;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_260;
  uint local_258;
  byte local_253;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_250;
  uint local_248;
  byte local_243;
  undefined1 *local_240;
  EnumTypeSyntax *local_238;
  EvaluatedDimension local_230;
  anon_class_80_10_279d319d local_210;
  anon_class_56_7_20ba5b4c local_1c0;
  SourceRange local_188;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_170;
  anon_class_16_2_bd45431b local_148;
  Token local_138 [12];
  Storage *local_78;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::SVInt,_slang::SourceLocation>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::SVInt,_void>,_std::equal_to<slang::SVInt>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::SVInt,_slang::SourceLocation>,_192UL,_16UL>_>
  local_70;
  
  local_270 = insertCB.callback;
  local_2a4 = 0x20;
  node = *(DataTypeSyntax **)&(comp->options).maxConstexprBacktrace;
  local_298 = comp;
  local_278 = context;
  if (node == (DataTypeSyntax *)0x0) {
    pEVar11 = (EnumType *)this[2].super_IntegralType.super_Type.super_Symbol.nextInScope;
    local_2a0 = pEVar11;
    local_288 = pEVar11;
  }
  else {
    pEVar6 = (EnumType *)
             Compilation::getType((Compilation *)this,node,(ASTContext *)syntax,(Type *)0x0);
    pEVar11 = (EnumType *)(pEVar6->super_IntegralType).super_Type.canonical;
    local_288 = pEVar6;
    if (pEVar11 == (EnumType *)0x0) {
      Type::resolveCanonical((Type *)pEVar6);
      pEVar11 = (EnumType *)(pEVar6->super_IntegralType).super_Type.canonical;
    }
    pTVar8 = (pEVar11->super_IntegralType).super_Type.canonical;
    local_2a0 = pEVar11;
    if (pTVar8 == (Type *)0x0) {
      Type::resolveCanonical((Type *)pEVar11);
      pTVar8 = (pEVar11->super_IntegralType).super_Type.canonical;
    }
    bVar5 = 0x20;
    if ((pTVar8->super_Symbol).kind == ErrorType) goto LAB_0031bf5f;
    bVar4 = Type::isSimpleBitVector((Type *)pEVar11);
    if ((!bVar4) &&
       (pSVar12 = *(SyntaxNode **)&(local_298->options).maxConstexprBacktrace,
       pSVar12->kind == NamedType)) {
      local_138[0] = slang::syntax::SyntaxNode::getFirstToken(pSVar12);
      SVar7 = parsing::Token::location(local_138);
      diag = ASTContext::addDiag((ASTContext *)syntax,(DiagCode)0xf0009,SVar7);
      ast::operator<<(diag,(Type *)local_288);
      pEVar11 = (EnumType *)this[2].super_Scope.nameMap;
      bVar5 = local_2a4;
      local_2a0 = pEVar11;
      goto LAB_0031bf5f;
    }
  }
  bVar5 = Type::getBitWidth((Type *)pEVar11);
  local_2a4 = bVar5;
LAB_0031bf5f:
  bVar4 = Type::isSigned((Type *)pEVar11);
  SVInt::SVInt((SVInt *)&local_250,bVar5,0,bVar4);
  SVInt::setAllOnes((SVInt *)&local_250);
  bVar5 = local_2a4;
  bVar4 = Type::isSigned((Type *)local_2a0);
  SVInt::SVInt((SVInt *)&local_260,bVar5,1,bVar4);
  local_170._M_index = '\0';
  local_188.startLoc = (SourceLocation)0x0;
  local_188.endLoc = (SourceLocation)0x0;
  local_2a5 = true;
  SVar7 = parsing::Token::location((Token *)&(local_298->options).maxCheckerInstanceDepth);
  local_138[0]._0_8_ = SVar7;
  local_290 = BumpAllocator::
              emplace<slang::ast::EnumType,slang::ast::Compilation&,slang::SourceLocation,slang::ast::Type_const&,slang::ast::ASTContext_const&>
                        ((BumpAllocator *)this,(Compilation *)this,(SourceLocation *)local_138,
                         (Type *)local_288,(ASTContext *)syntax);
  (local_290->super_IntegralType).super_Type.super_Symbol.originatingSyntax =
       (SyntaxNode *)local_298;
  pSVar12 = (SyntaxNode *)(local_298->super_BumpAllocator).endPtr;
  if ((pSVar12 != (SyntaxNode *)0x0) && (pSVar12->kind == TypedefDeclaration)) {
    sVar15 = parsing::Token::valueText((Token *)&pSVar12[4].parent);
    (local_290->super_IntegralType).super_Type.super_Symbol.name = sVar15;
  }
  pEVar11 = local_2a0;
  pTVar8 = (local_2a0->super_IntegralType).super_Type.canonical;
  local_268 = (EnumValueSymbol *)this;
  if (pTVar8 == (Type *)0x0) {
    Type::resolveCanonical((Type *)local_2a0);
    pTVar8 = (pEVar11->super_IntegralType).super_Type.canonical;
  }
  pEVar11 = local_2a0;
  if ((pTVar8->super_Symbol).kind != ErrorType) {
    pEVar11 = local_290;
  }
  local_70.arrays.groups_size_index = 0x3f;
  local_70.arrays.groups_size_mask = 1;
  local_70.arrays.elements_ = (value_type_pointer)0x0;
  local_70.arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  local_70.size_ctrl.ml = 0;
  local_70.size_ctrl.size = 0;
  local_210.checkValue = &local_148;
  local_210.first = &local_2a5;
  local_210.previous = (ConstantValue *)&local_170;
  local_210.previousRange = &local_188;
  local_210.bitWidth = &local_2a4;
  index = (_Optional_payload_base<int>)&local_288;
  local_210.cb = (Type **)&local_2a0;
  local_240 = (undefined1 *)
              ((long)&((local_298->options).topModules.table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                       .arrays.elements_)->_M_len + 1);
  local_210.context = (ASTContext *)syntax;
  local_210.base = (Type **)index;
  local_210.allOnes = (SVInt *)&local_250;
  local_210.one = (SVInt *)&local_260;
  local_1c0.first = local_210.first;
  local_1c0.previous = local_210.previous;
  local_1c0.previousRange = local_210.previousRange;
  local_1c0.context = (ASTContext *)syntax;
  local_1c0.bitWidth = local_210.bitWidth;
  local_1c0.base = (Type **)index;
  local_1c0.checkValue = local_210.checkValue;
  local_148.usedValues =
       (SmallMap<slang::SVInt,_slang::SourceLocation,_8UL,_std::pair<const_slang::SVInt,_slang::SourceLocation>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::SVInt,_slang::SourceLocation>,_192UL,_16UL>_>
        *)local_138;
  local_148.context = (ASTContext *)syntax;
  local_78 = (Storage *)local_138;
  local_70.
  super_empty_value<slang::detail::hashing::StackAllocator<std::pair<const_slang::SVInt,_slang::SourceLocation>,_192UL,_16UL>,_2U,_false>
  .value_.storage =
       (StackAllocator<std::pair<const_slang::SVInt,_slang::SourceLocation>,_192UL,_16UL>)
       (StackAllocator<std::pair<const_slang::SVInt,_slang::SourceLocation>,_192UL,_16UL>)local_138;
  if ((undefined1 *)0x1 < local_240) {
    local_240 = (undefined1 *)((ulong)local_240 >> 1);
    local_280 = &local_290->super_Scope;
    puVar13 = (undefined1 *)0x0;
    pEVar6 = local_290;
    local_238 = syntax;
    do {
      ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((local_298->options).topModules.table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                            .arrays.groups_ + (long)puVar13 * 3));
      compilation = (Compilation *)*ppSVar9;
      sVar1 = (compilation->options).topModules.table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
              .arrays.groups_size_index;
      if (sVar1 == 1) {
LAB_0031c224:
        ASTContext::evalUnpackedDimension
                  (&local_230,(ASTContext *)syntax,
                   (VariableDimensionSyntax *)
                   **(undefined8 **)
                     &(compilation->options).defaultTimeScale.
                      super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                      super__Optional_payload_base<slang::TimeScale>._M_engaged);
        if (local_230.kind - Range < 2) {
          uVar14 = (ulong)(uint)local_230.range.left;
          SVar16 = slang::syntax::SyntaxNode::sourceRange
                             ((SyntaxNode *)
                              **(undefined8 **)
                                &(compilation->options).defaultTimeScale.
                                 super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                                 super__Optional_payload_base<slang::TimeScale>._M_engaged);
          bVar4 = ASTContext::requirePositive
                            ((ASTContext *)syntax,(optional<int>)(uVar14 | 0x100000000),SVar16);
          if (bVar4) {
            uVar14 = (ulong)(uint)local_230.range.right;
            SVar16 = slang::syntax::SyntaxNode::sourceRange
                               ((SyntaxNode *)
                                **(undefined8 **)
                                  &(compilation->options).defaultTimeScale.
                                   super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                                   super__Optional_payload_base<slang::TimeScale>._M_engaged);
            bVar4 = ASTContext::requirePositive
                              ((ASTContext *)syntax,(optional<int>)(uVar14 | 0x100000000),SVar16);
            if (bVar4) {
              piVar3 = *(int **)(*(long *)(**(long **)&(compilation->options).defaultTimeScale.
                                                                                                              
                                                  super__Optional_base<slang::TimeScale,_true,_true>
                                                  ._M_payload.
                                                  super__Optional_payload_base<slang::TimeScale>.
                                                  _M_engaged + 0x28) + 0x18);
              if (*piVar3 == 0x1b0) {
                if (((*(SyntaxNode **)(piVar3 + 6))->kind | TokenList) != IntegerVectorExpression) {
                  SVar16 = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)(piVar3 + 6));
                  ASTContext::addDiag((ASTContext *)syntax,(DiagCode)0x230009,SVar16);
                }
                pSVar12 = *(SyntaxNode **)(piVar3 + 0xc);
LAB_0031c32b:
                if ((pSVar12->kind | TokenList) != IntegerVectorExpression) {
                  SVar16 = slang::syntax::SyntaxNode::sourceRange(pSVar12);
                  ASTContext::addDiag((ASTContext *)syntax,(DiagCode)0x230009,SVar16);
                }
              }
              else if (*piVar3 == 0x35) {
                pSVar12 = *(SyntaxNode **)(piVar3 + 6);
                goto LAB_0031c32b;
              }
              uVar14 = (ulong)(uint)local_230.range.left;
              pEVar10 = EnumValueSymbol::fromSyntax
                                  (local_268,compilation,(DeclaratorSyntax *)pEVar11,
                                   (Type *)(uVar14 | 0x100000000),(optional<int>)index);
              index._M_payload = (_Storage<int,_true>)0x1;
              index._M_engaged = false;
              index._5_3_ = 0;
              Scope::insertMember(local_280,(Symbol *)pEVar10,(pEVar6->super_Scope).lastMember,false
                                  ,true);
              (*(code *)local_278)(local_270,pEVar10);
              pEVar2 = (EqualsValueClauseSyntax *)
                       (compilation->options).topModules.table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                       .arrays.groups_size_mask;
              if (pEVar2 == (EqualsValueClauseSyntax *)0x0) {
                SVar16 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)compilation);
                fromSyntax::anon_class_80_10_279d319d::operator()(&local_210,pEVar10,SVar16);
              }
              else {
                fromSyntax::anon_class_56_7_20ba5b4c::operator()(&local_1c0,pEVar10,pEVar2);
              }
              bVar4 = local_230.range.left < local_230.range.right;
              while (pEVar6 = local_290, syntax = local_238, (uint)uVar14 != local_230.range.right)
              {
                uVar14 = (ulong)((uint)uVar14 + (uint)bVar4 * 2 + -1);
                pEVar10 = EnumValueSymbol::fromSyntax
                                    (local_268,compilation,(DeclaratorSyntax *)pEVar11,
                                     (Type *)(uVar14 | 0x100000000),(optional<int>)index);
                index._M_payload = (_Storage<int,_true>)0x1;
                index._M_engaged = false;
                index._5_3_ = 0;
                Scope::insertMember(local_280,(Symbol *)pEVar10,(local_290->super_Scope).lastMember,
                                    false,true);
                (*(code *)local_278)(local_270,pEVar10);
                SVar16 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)compilation);
                fromSyntax::anon_class_80_10_279d319d::operator()(&local_210,pEVar10,SVar16);
              }
            }
          }
        }
      }
      else {
        if (sVar1 != 0) {
          SVar16 = slang::syntax::SyntaxNode::sourceRange
                             ((SyntaxNode *)&(compilation->options).maxInstanceArray);
          ASTContext::addDiag((ASTContext *)syntax,(DiagCode)0x40009,SVar16);
          goto LAB_0031c224;
        }
        pEVar10 = EnumValueSymbol::fromSyntax
                            (local_268,compilation,(DeclaratorSyntax *)pEVar11,(Type *)0x0,
                             (optional<int>)index);
        index._M_payload = (_Storage<int,_true>)0x1;
        index._M_engaged = false;
        index._5_3_ = 0;
        Scope::insertMember(local_280,(Symbol *)pEVar10,(pEVar6->super_Scope).lastMember,false,true)
        ;
        (*(code *)local_278)(local_270,pEVar10);
        pEVar2 = (EqualsValueClauseSyntax *)
                 (compilation->options).topModules.table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                 .arrays.groups_size_mask;
        if (pEVar2 == (EqualsValueClauseSyntax *)0x0) {
          SVar16 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)compilation);
          fromSyntax::anon_class_80_10_279d319d::operator()(&local_210,pEVar10,SVar16);
        }
        else {
          fromSyntax::anon_class_56_7_20ba5b4c::operator()(&local_1c0,pEVar10,pEVar2);
        }
      }
      puVar13 = puVar13 + 1;
    } while (puVar13 != local_240);
  }
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<slang::SVInt,_slang::SourceLocation>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::SVInt,_void>,_std::equal_to<slang::SVInt>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::SVInt,_slang::SourceLocation>,_192UL,_16UL>_>
  ::~table_core(&local_70);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_170);
  if (((0x40 < local_258) || ((local_253 & 1) != 0)) && ((void *)local_260.val != (void *)0x0)) {
    operator_delete__(local_260.pVal);
  }
  if (((0x40 < local_248) || ((local_243 & 1) != 0)) && ((void *)local_250.val != (void *)0x0)) {
    operator_delete__(local_250.pVal);
  }
  return (Type *)pEVar11;
}

Assistant:

const Type& EnumType::fromSyntax(Compilation& comp, const EnumTypeSyntax& syntax,
                                 const ASTContext& context,
                                 function_ref<void(const Symbol&)> insertCB) {
    const Type* base;
    const Type* cb;
    bitwidth_t bitWidth = 32;

    if (!syntax.baseType) {
        // If no explicit base type is specified we default to an int.
        base = &comp.getIntType();
        cb = base;
        bitWidth = cb->getBitWidth();
    }
    else {
        base = &comp.getType(*syntax.baseType, context);
        cb = &base->getCanonicalType();
        if (!cb->isError()) {
            // Error if the named type is invalid for an enum base type. Other invalid types
            // will have been diagnosed already by the parser.
            if (!cb->isSimpleBitVector() && syntax.baseType->kind == SyntaxKind::NamedType) {
                context.addDiag(diag::InvalidEnumBase, syntax.baseType->getFirstToken().location())
                    << *base;
                cb = &comp.getErrorType();
            }
            else {
                bitWidth = cb->getBitWidth();
                SLANG_ASSERT(bitWidth);
            }
        }
    }

    SVInt allOnes(bitWidth, 0, cb->isSigned());
    allOnes.setAllOnes();

    SVInt one(bitWidth, 1, cb->isSigned());
    ConstantValue previous;
    SourceRange previousRange;
    bool first = true;

    auto enumType = comp.emplace<EnumType>(comp, syntax.keyword.location(), *base, context);
    enumType->setSyntax(syntax);

    // If this enum is inside a typedef we want to save the name here so that
    // when printing the types of our enum values we can refer back to this.
    if (syntax.parent && syntax.parent->kind == SyntaxKind::TypedefDeclaration)
        enumType->name = syntax.parent->as<TypedefDeclarationSyntax>().name.valueText();

    auto resultType = cb->isError() ? cb : enumType;

    // Enum values must be unique; this set and lambda are used to check that.
    SmallMap<SVInt, SourceLocation, 8> usedValues;
    auto checkValue = [&usedValues, &context](const ConstantValue& cv, SourceLocation loc) {
        if (!cv)
            return;

        auto& value = cv.integer();
        auto pair = usedValues.emplace(value, loc);
        if (!pair.second) {
            auto& diag = context.addDiag(diag::EnumValueDuplicate, loc) << value;
            diag.addNote(diag::NotePreviousDefinition, pair.first->second);
        }
    };

    // For enumerands that have an initializer, set it up appropriately.
    auto setInitializer = [&](EnumValueSymbol& ev, const EqualsValueClauseSyntax& initializer) {
        // Clear our previous state in case there's an error and we need to exit early.
        first = false;
        previous = nullptr;

        // Create the initializer expression.
        ev.setInitializerSyntax(*initializer.expr, initializer.equals.location());
        auto initExpr = ev.getInitializer();
        SLANG_ASSERT(initExpr);
        if (initExpr->bad())
            return;

        // Drill down to the original initializer before any conversions are applied.
        initExpr = &initExpr->unwrapImplicitConversions();
        previousRange = initExpr->sourceRange;

        // [6.19] says that the initializer for an enum value must be an integer expression that
        // does not truncate any bits. Furthermore, if a sized literal constant is used, it must
        // be sized exactly to the size of the enum base type.
        auto& rt = *initExpr->type;
        if (!rt.isIntegral()) {
            context.addDiag(diag::ValueMustBeIntegral, previousRange);
            return;
        }

        if (bitWidth != rt.getBitWidth() && initExpr->kind == ExpressionKind::IntegerLiteral &&
            !initExpr->as<IntegerLiteral>().isDeclaredUnsized) {
            auto& diag = context.addDiag(diag::EnumValueSizeMismatch, previousRange);
            diag << rt.getBitWidth() << bitWidth;
        }

        ev.getValue();
        if (!initExpr->constant)
            return;

        // An enumerated name with x or z assignments assigned to an enum with no explicit data type
        // or an explicit 2-state declaration shall be a syntax error.
        auto& value = initExpr->constant->integer();
        if (!base->isFourState() && value.hasUnknown()) {
            context.addDiag(diag::EnumValueUnknownBits, previousRange) << value << *base;
            return;
        }

        // Any enumeration encoding value that is outside the representable range of the enum base
        // type shall be an error. For an unsigned base type, this occurs if the cast truncates the
        // value and any of the discarded bits are nonzero. For a signed base type, this occurs if
        // the cast truncates the value and any of the discarded bits are not equal to the sign bit
        // of the result.
        if (value.getBitWidth() > bitWidth) {
            bool good = true;
            if (!base->isSigned()) {
                good = exactlyEqual(value[int32_t(bitWidth)], logic_t(false)) &&
                       value.isSignExtendedFrom(bitWidth);
            }
            else {
                good = value.isSignExtendedFrom(bitWidth - 1);
            }

            if (!good) {
                context.addDiag(diag::EnumValueOutOfRange, previousRange) << value << *base;
                return;
            }
        }

        previous = ev.getValue();
        checkValue(previous, previousRange.start());
    };

    // For enumerands that have no initializer, infer the value via this function.
    auto inferValue = [&](EnumValueSymbol& ev, SourceRange range) {
        auto loc = range.start();
        SVInt value;
        if (first) {
            value = SVInt(bitWidth, 0, cb->isSigned());
            first = false;
        }
        else if (!previous) {
            return;
        }
        else {
            auto& prev = previous.integer();
            if (prev.hasUnknown()) {
                auto& diag = context.addDiag(diag::EnumIncrementUnknown, loc);
                diag << prev << *base << previousRange;
                previous = nullptr;
                return;
            }
            else if (prev == allOnes) {
                auto& diag = context.addDiag(diag::EnumValueOverflow, loc);
                diag << prev << *base << previousRange;
                previous = nullptr;
                return;
            }

            value = prev + one;
        }

        checkValue(value, loc);

        ev.setValue(value);
        previous = std::move(value);
        previousRange = range;
    };

    for (auto member : syntax.members) {
        if (member->dimensions.empty()) {
            auto& ev = EnumValueSymbol::fromSyntax(comp, *member, *resultType, std::nullopt);
            enumType->addMember(ev);
            insertCB(ev);

            if (member->initializer)
                setInitializer(ev, *member->initializer);
            else
                inferValue(ev, member->sourceRange());
        }
        else {
            if (member->dimensions.size() > 1) {
                context.addDiag(diag::EnumRangeMultiDimensional, member->dimensions.sourceRange());
            }

            auto dim = context.evalUnpackedDimension(*member->dimensions[0]);
            if (!dim.isRange())
                continue;

            // Range must be positive.
            if (!context.requirePositive(std::optional(dim.range.left),
                                         member->dimensions[0]->sourceRange()) ||
                !context.requirePositive(std::optional(dim.range.right),
                                         member->dimensions[0]->sourceRange())) {
                continue;
            }

            // Enum ranges must be integer literals.
            checkEnumRange(context, *member->dimensions[0]);

            // Set up the first element using the initializer. All other elements (if there are any)
            // don't get the initializer.
            int32_t index = dim.range.left;
            {
                auto& ev = EnumValueSymbol::fromSyntax(comp, *member, *resultType, index);
                enumType->addMember(ev);
                insertCB(ev);

                if (member->initializer)
                    setInitializer(ev, *member->initializer);
                else
                    inferValue(ev, member->sourceRange());
            }

            bool down = dim.range.isLittleEndian();
            while (index != dim.range.right) {
                index = down ? index - 1 : index + 1;

                auto& ev = EnumValueSymbol::fromSyntax(comp, *member, *resultType, index);
                enumType->addMember(ev);
                insertCB(ev);

                inferValue(ev, member->sourceRange());
            }
        }
    }

    return *resultType;
}